

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O0

Am_Wrapper * score_as_string_proc(Am_Object *self)

{
  Am_Value *this;
  void *this_00;
  Am_Wrapper *pAVar1;
  Am_String local_1f8 [8];
  Am_String str;
  ostrstream local_1e0 [8];
  ostrstream oss;
  char local_78 [8];
  char line [100];
  int score;
  Am_Object *self_local;
  
  unique0x100000e9 = self;
  this = (Am_Value *)Am_Object::Get((ushort)self,(ulong)SCORE);
  line._92_4_ = Am_Value::operator_cast_to_int(this);
  std::ostrstream::ostrstream(local_1e0,local_78,100,_S_out);
  this_00 = (void *)std::ostream::operator<<(local_1e0,line._92_4_);
  std::ostream::operator<<(this_00,std::ends<char,std::char_traits<char>>);
  Am_String::Am_String(local_1f8,local_78,true);
  pAVar1 = Am_String::operator_cast_to_Am_Wrapper_(local_1f8);
  Am_String::~Am_String(local_1f8);
  std::ostrstream::~ostrstream(local_1e0);
  return pAVar1;
}

Assistant:

Am_Define_String_Formula(score_as_string)
{
  int score = self.Get(SCORE);
  char line[100];
  OSTRSTREAM_CONSTR(oss, line, 100, ios::out);
  oss << score << ends;
  OSTRSTREAM_COPY(oss, line, 100);
  Am_String str = line;
  return str;
}